

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

void __thiscall despot::PocmanPOMCPPrior::ComputePreference(PocmanPOMCPPrior *this,State *state)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int local_48;
  Coord newpos_1;
  value_type local_3c;
  int a_2;
  int a_1;
  OBS_TYPE observation;
  ACT_TYPE action;
  Coord newpos;
  int a;
  PocmanState *pocstate;
  State *state_local;
  PocmanPOMCPPrior *this_local;
  
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)&this->field_0x60);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)&this->field_0x48);
  for (_newpos = 0; _newpos < 4; _newpos = _newpos + 1) {
    register0x00000000 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),_newpos);
    if ((-1 < observation._4_4_) && (-1 < register0x00000000)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&this->field_0x60,(value_type *)&newpos);
    }
  }
  sVar3 = History::Size((History *)&this->field_0x10);
  if (sVar3 != 0) {
    observation._0_4_ = History::LastAction((History *)&this->field_0x10);
    _a_2 = History::LastObservation((History *)&this->field_0x10);
    if ((*(int *)(state + 0x84) < 1) || ((_a_2 & 0xf) == 0)) {
      for (_newpos_1 = 0; _newpos_1 < 4; _newpos_1 = _newpos_1 + 1) {
        lVar4 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),_newpos_1);
        local_48 = (int)lVar4;
        if ((((-1 < local_48) && (-1 < lVar4)) && (bVar1 = CheckFlag((int)_a_2,_newpos_1), !bVar1))
           && (iVar2 = despot::Compass::Opposite(_newpos_1), iVar2 != (ACT_TYPE)observation)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&this->field_0x48,(value_type *)&newpos_1)
          ;
        }
      }
    }
    else {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        bVar1 = CheckFlag((int)_a_2,local_3c);
        if (bVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&this->field_0x48,&local_3c);
        }
      }
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		const PocmanState& pocstate = static_cast<const PocmanState&>(state);
		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 4; a++) {
			Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
			if (newpos.x >= 0 && newpos.y >= 0)
				legal_actions_.push_back(a);
		}

		if (history_.Size()) {
			ACT_TYPE action = history_.LastAction();
			OBS_TYPE observation = history_.LastObservation();

			// If power pill and can see a ghost then chase it
			if (pocstate.power_steps > 0 && ((observation & 15) != 0)) {
				for (int a = 0; a < 4; a++)
					if (CheckFlag(observation, a))
						preferred_actions_.push_back(a);
			} else { // Otherwise avoid observed ghosts and avoid changing directions
				for (int a = 0; a < 4; a++) {
					Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
					if (newpos.x >= 0 && newpos.y >= 0
						&& !CheckFlag(observation, a)
						&& Compass::Opposite(a) != action)
						preferred_actions_.push_back(a);
				}
			}
		}
	}